

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

bool __thiscall
ON_Font::SetFontCharacteristicsForExperts
          (ON_Font *this,double point_size,ON_wString postscript_name,ON_wString quartet_name,
          Member quartet_member,ON_wString family_name,ON_wString face_name,Weight font_weight,
          Style font_style,Stretch font_stretch,bool bUnderlined,bool bStrikethrough,
          uchar logfont_charset,int windows_logfont_weight,double apple_font_weight_trait,
          ON_PANOSE1 panose1)

{
  ON_wString *pOVar1;
  undefined8 uVar2;
  bool bVar3;
  ON_TextLog *text_log;
  ON_wString local_40;
  wchar_t *local_38;
  
  this->m_point_size = point_size;
  this->m_windows_logfont_weight = windows_logfont_weight;
  this->m_apple_font_weight_trait = apple_font_weight_trait;
  local_38 = face_name.m_s;
  ON_wString::Duplicate(&local_40);
  ON_wString::operator=(&this->m_en_windows_logfont_name,&local_40);
  ON_wString::~ON_wString(&local_40);
  ON_wString::TrimLeftAndRight(&this->m_en_windows_logfont_name,(wchar_t *)0x0);
  this->m_quartet_member = quartet_member;
  ON_wString::Duplicate(&local_40);
  pOVar1 = &this->m_en_postscript_name;
  ON_wString::operator=(pOVar1,&local_40);
  ON_wString::~ON_wString(&local_40);
  ON_wString::TrimLeftAndRight(pOVar1,(wchar_t *)0x0);
  ON_wString::operator=(&this->m_loc_postscript_name,pOVar1);
  ON_wString::Duplicate(&local_40);
  pOVar1 = &this->m_en_family_name;
  ON_wString::operator=(pOVar1,&local_40);
  ON_wString::~ON_wString(&local_40);
  ON_wString::TrimLeftAndRight(pOVar1,(wchar_t *)0x0);
  ON_wString::operator=(&this->m_loc_family_name,pOVar1);
  ON_wString::Duplicate(&local_40);
  text_log = (ON_TextLog *)&this->m_en_face_name;
  ON_wString::operator=((ON_wString *)text_log,&local_40);
  ON_wString::~ON_wString(&local_40);
  ON_wString::TrimLeftAndRight((ON_wString *)text_log,(wchar_t *)0x0);
  ON_wString::operator=(&this->m_loc_face_name,(ON_wString *)text_log);
  this->m_font_weight = font_weight;
  this->m_font_stretch = font_stretch;
  this->m_font_style = font_style;
  this->m_font_bUnderlined = bUnderlined;
  this->m_font_bStrikethrough = bStrikethrough;
  this->m_logfont_charset = logfont_charset;
  (this->m_panose1).m_family_kind = panose1.m_family_kind;
  (this->m_panose1).m_prop1 = panose1.m_prop1;
  (this->m_panose1).m_prop2 = panose1.m_prop2;
  (this->m_panose1).m_prop3 = panose1.m_prop3;
  (this->m_panose1).m_prop4 = panose1.m_prop4;
  (this->m_panose1).m_prop5 = panose1.m_prop5;
  (this->m_panose1).m_prop6 = panose1.m_prop6;
  (this->m_panose1).m_prop7 = panose1.m_prop7;
  (this->m_panose1).m_prop8 = panose1.m_prop8;
  (this->m_panose1).m_prop9 = panose1.m_prop9;
  this->m_font_origin = Unset;
  this->m_simulated = '\0';
  uVar2 = ON_SHA1_Hash::ZeroDigest.m_digest._8_8_;
  *(undefined8 *)(this->m_font_characteristics_hash).m_digest =
       ON_SHA1_Hash::ZeroDigest.m_digest._0_8_;
  *(undefined8 *)((this->m_font_characteristics_hash).m_digest + 8) = uVar2;
  *(undefined4 *)((this->m_font_characteristics_hash).m_digest + 0x10) =
       ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
  bVar3 = IsValid(this,text_log);
  return bVar3;
}

Assistant:

bool ON_Font::SetFontCharacteristicsForExperts(
  double point_size,
  const ON_wString postscript_name,
  const ON_wString quartet_name,
  ON_FontFaceQuartet::Member quartet_member,
  const ON_wString family_name,
  const ON_wString face_name,
  ON_Font::Weight font_weight,
  ON_Font::Style font_style,
  ON_Font::Stretch font_stretch,
  bool bUnderlined,
  bool bStrikethrough,
  unsigned char logfont_charset,
  int windows_logfont_weight,
  double apple_font_weight_trait,
  ON_PANOSE1 panose1
)
{
  this->m_point_size = point_size;

  this->m_windows_logfont_weight = windows_logfont_weight;
  this->m_apple_font_weight_trait = apple_font_weight_trait;

  this->m_en_windows_logfont_name = quartet_name.Duplicate();
  this->m_en_windows_logfont_name.TrimLeftAndRight();

  this->m_quartet_member = quartet_member;

  this->m_en_postscript_name = postscript_name.Duplicate();
  this->m_en_postscript_name.TrimLeftAndRight();
  this->m_loc_postscript_name = this->m_en_postscript_name;

  this->m_en_family_name = family_name.Duplicate();
  this->m_en_family_name.TrimLeftAndRight();
  this->m_loc_family_name = this->m_en_family_name;

  this->m_en_face_name = face_name.Duplicate();
  this->m_en_face_name.TrimLeftAndRight();
  this->m_loc_face_name = this->m_en_face_name;

  this->m_font_weight = font_weight;
  this->m_font_stretch = font_stretch;
  this->m_font_style = font_style;

  this->m_font_bUnderlined = bUnderlined;
  this->m_font_bStrikethrough = bStrikethrough;

  this->m_logfont_charset = logfont_charset;

  this->m_panose1 = panose1;

  this->m_font_origin = ON_Font::Origin::Unset;
  this->m_simulated = 0;
  this->m_font_characteristics_hash = ON_SHA1_Hash::ZeroDigest;

  return this->IsValid();
}